

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReader::readEditFaceData(PtexReader *this)

{
  pointer *ppFVar1;
  pointer pFVar2;
  int size;
  int iVar3;
  pointer pFVar4;
  uint8_t *puVar5;
  iterator __position;
  pointer pFVar6;
  bool bVar7;
  long lVar8;
  EditFaceDataHeader efdh;
  uint local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  int32_t iStack_40;
  uint32_t local_3c;
  FaceEdit local_38;
  
  local_50 = 0;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  iStack_40 = -1;
  local_3c = 0;
  bVar7 = readBlock(this,&local_54,0x1c,true);
  if (bVar7) {
    lVar8 = (long)(int)local_54;
    if ((-1 < lVar8) && (local_54 < (this->_header).nfaces)) {
      pFVar4 = (this->_faceinfo).
               super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar2 = pFVar4 + lVar8;
      (pFVar2->res).ulog2 = (char)(short)local_50;
      (pFVar2->res).vlog2 = (char)((ushort)(short)local_50 >> 8);
      pFVar2->adjedges = (char)((uint)local_50 >> 0x10);
      pFVar2->flags = (char)((uint)local_50 >> 0x18);
      pFVar2->adjfaces[0] = uStack_4c;
      *(ulong *)(pFVar2->adjfaces + 1) = CONCAT44(uStack_44,uStack_48);
      pFVar4[lVar8].adjfaces[3] = iStack_40;
      pFVar4[lVar8].flags = pFVar4[lVar8].flags | 2;
      size = this->_pixelsize;
      puVar5 = this->_constdata;
      bVar7 = readBlock(this,puVar5 + (int)(size * local_54),size,true);
      if (bVar7) {
        if (((this->_premultiply == true) && (iVar3 = (this->_header).alphachan, -1 < iVar3)) &&
           (iVar3 < (int)(uint)(this->_header).nchannels)) {
          PtexUtils::multalpha
                    (puVar5 + (int)(size * local_54),1,(this->_header).datatype,
                     (uint)(this->_header).nchannels,(this->_header).alphachan);
        }
        if ((pFVar4[lVar8].flags & 1) == 0) {
          local_38.pos = 0;
          local_38.faceid = 0;
          local_38.fdh.data = 0;
          __position._M_current =
               (this->_faceedits).
               super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->_faceedits).
              super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
            ::_M_realloc_insert<Ptex::v2_2::PtexReader::FaceEdit>
                      (&this->_faceedits,__position,&local_38);
          }
          else {
            (__position._M_current)->pos = 0;
            (__position._M_current)->faceid = 0;
            (__position._M_current)->fdh = 0;
            ppFVar1 = &(this->_faceedits).
                       super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar1 = *ppFVar1 + 1;
          }
          pFVar6 = (this->_faceedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pFVar6[-1].pos = this->_pos;
          pFVar6[-1].faceid = local_54;
          pFVar6[-1].fdh.data = local_3c;
        }
      }
    }
  }
  return;
}

Assistant:

void PtexReader::readEditFaceData()
{
    // read header
    EditFaceDataHeader efdh;
    if (!readBlock(&efdh, EditFaceDataHeaderSize)) return;

    // update face info
    int faceid = efdh.faceid;
    if (faceid < 0 || size_t(faceid) >= _header.nfaces) return;
    FaceInfo& f = _faceinfo[faceid];
    f = efdh.faceinfo;
    f.flags |= FaceInfo::flag_hasedits;

    // read const value now
    uint8_t* constdata = _constdata + _pixelsize * faceid;
    if (!readBlock(constdata, _pixelsize)) return;
    if (_premultiply && _header.hasAlpha())
        PtexUtils::multalpha(constdata, 1, datatype(),
                             _header.nchannels, _header.alphachan);

    // update header info for remaining data
    if (!f.isConstant()) {
        _faceedits.push_back(FaceEdit());
        FaceEdit& e = _faceedits.back();
        e.pos = tell();
        e.faceid = faceid;
        e.fdh = efdh.fdh;
    }
}